

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

float __thiscall
notch::core::EuclideanLoss::output(EuclideanLoss *this,Array *actual,Array *expected)

{
  size_t sVar1;
  size_t sVar2;
  float *pfVar3;
  float fVar4;
  double dVar5;
  ulong uStack_30;
  float delta;
  size_t i;
  float lossSquared;
  Array *expected_local;
  Array *actual_local;
  EuclideanLoss *this_local;
  
  i._4_4_ = 0.0;
  sVar1 = this->nSize;
  sVar2 = std::valarray<float>::size(actual);
  if (sVar1 != sVar2) {
    __assert_fail("nSize == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x789,"virtual float notch::EuclideanLoss::output(const Array &, const Array &)")
    ;
  }
  sVar1 = this->nSize;
  sVar2 = std::valarray<float>::size(expected);
  if (sVar1 == sVar2) {
    for (uStack_30 = 0; uStack_30 < this->nSize; uStack_30 = uStack_30 + 1) {
      pfVar3 = std::valarray<float>::operator[](expected,uStack_30);
      fVar4 = *pfVar3;
      pfVar3 = std::valarray<float>::operator[](actual,uStack_30);
      fVar4 = fVar4 - *pfVar3;
      i._4_4_ = fVar4 * fVar4 + i._4_4_;
      pfVar3 = std::valarray<float>::operator[](&this->lossGrad,uStack_30);
      *pfVar3 = fVar4;
    }
    dVar5 = std::sqrt((double)(ulong)(uint)i._4_4_);
    return SUB84(dVar5,0);
  }
  __assert_fail("nSize == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x78a,"virtual float notch::EuclideanLoss::output(const Array &, const Array &)");
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        float lossSquared = 0.0;
        assert (nSize == actual.size());
        assert (nSize == expected.size());
        for (size_t i = 0; i < nSize; ++i) {
            float delta = expected[i] - actual[i];
            lossSquared += (delta*delta);
            lossGrad[i] = delta;
        }
        return std::sqrt(lossSquared);
    }